

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O2

long coda_ascii_parse_uint64
               (char *buffer,long buffer_length,uint64_t *dst,int ignore_trailing_bytes)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  char *message;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = buffer_length;
  while( true ) {
    bVar1 = *buffer;
    uVar3 = (ulong)bVar1;
    uVar6 = buffer_length >> 0x3f & buffer_length;
    if (((long)uVar5 < 1) || ((bVar1 != 0x20 && (uVar6 = uVar5, bVar1 != 9)))) break;
    buffer = (char *)((byte *)buffer + 1);
    uVar5 = uVar5 - 1;
  }
  pbVar4 = (byte *)buffer + (bVar1 == 0x2b);
  uVar6 = uVar6 - (bVar1 == 0x2b);
  uVar5 = 0;
  for (lVar7 = 0; uVar2 = (long)uVar6 >> 0x3f & uVar6, 0 < (long)(uVar6 + lVar7); lVar7 = lVar7 + -1
      ) {
    bVar1 = *pbVar4;
    uVar3 = (ulong)bVar1;
    uVar2 = uVar6 + lVar7;
    if ((byte)(bVar1 - 0x3a) < 0xf6) break;
    uVar2 = ~(ulong)(byte)(bVar1 - 0x30);
    uVar3 = uVar2 % 10;
    if (uVar2 / 10 < uVar5) {
      message = "value too large for ascii integer";
      goto LAB_0011a0ae;
    }
    uVar5 = uVar5 * 10 + (ulong)(byte)(bVar1 - 0x30);
    pbVar4 = pbVar4 + 1;
  }
  if ((int)lVar7 == 0) {
    message = "invalid format for ascii integer (no digits)";
LAB_0011a0ae:
    coda_set_error(-0x67,message,uVar3);
    lVar7 = -1;
  }
  else {
    if ((ignore_trailing_bytes == 0) && (uVar2 != 0)) {
      uVar6 = (long)uVar2 >> 0x3f & uVar2;
      for (; 0 < (long)uVar2; uVar2 = uVar2 - 1) {
        bVar1 = *pbVar4;
        uVar3 = (ulong)bVar1;
        if ((bVar1 != 0x20) && (bVar1 != 9)) goto LAB_0011a0a7;
        pbVar4 = pbVar4 + 1;
      }
      if (uVar6 != 0) {
LAB_0011a0a7:
        message = "invalid format for ascii integer";
        goto LAB_0011a0ae;
      }
      uVar2 = 0;
    }
    *dst = uVar5;
    lVar7 = buffer_length - uVar2;
  }
  return lVar7;
}

Assistant:

long coda_ascii_parse_uint64(const char *buffer, long buffer_length, uint64_t *dst, int ignore_trailing_bytes)
{
    long length;
    int integer_length;
    uint64_t value;

    length = buffer_length;

    while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
    {
        buffer++;
        length--;
    }

    if (*buffer == '+')
    {
        buffer++;
        length--;
    }

    value = 0;
    integer_length = 0;
    while (length > 0)
    {
        int64_t digit;

        if (*buffer < '0' || *buffer > '9')
        {
            break;
        }
        digit = *buffer - '0';
        if (value > (MAXUINT64 - digit) / 10)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "value too large for ascii integer");
            return -1;
        }
        value = 10 * value + digit;
        integer_length++;
        buffer++;
        length--;
    }
    if (integer_length == 0)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer (no digits)");
        return -1;
    }
    if (!ignore_trailing_bytes && length != 0)
    {
        while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
        {
            buffer++;
            length--;
        }
        if (length != 0)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer");
            return -1;
        }
    }

    *dst = value;

    return buffer_length - length;
}